

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_clipping.cc
# Opt level: O1

bool S2::IntersectsRect(R2Point *a,R2Point *b,R2Rect *rect)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  byte bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  R2Rect bound;
  R2Rect local_50;
  
  R2Rect::FromPointPair(&local_50,a,b);
  bVar3 = R2Rect::Intersects(rect,&local_50);
  if (bVar3) {
    dVar5 = b->c_[0] - a->c_[0];
    dVar10 = b->c_[1] - a->c_[1];
    dVar6 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                      ((BasicVector<Vector2,_double,_2UL> *)rect,(uint)(0.0 >= dVar10));
    dVar7 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                      ((BasicVector<Vector2,_double,_2UL> *)(rect->bounds_ + 1),(uint)(dVar5 >= 0.0)
                      );
    dVar1 = a->c_[0];
    dVar2 = a->c_[1];
    dVar8 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                      ((BasicVector<Vector2,_double,_2UL> *)rect,(uint)(0.0 < dVar10));
    dVar9 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                      ((BasicVector<Vector2,_double,_2UL> *)(rect->bounds_ + 1),(uint)(dVar5 < 0.0))
    ;
    bVar4 = -(0.0 <= (dVar7 - dVar2) * dVar5 + (0.0 - (dVar6 - dVar1) * dVar10)) &
            -((dVar9 - a->c_[1]) * dVar5 + (0.0 - (dVar8 - a->c_[0]) * dVar10) <= 0.0);
  }
  else {
    bVar4 = 0;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool IntersectsRect(const R2Point& a, const R2Point& b, const R2Rect& rect) {
  // First check whether the bound of AB intersects "rect".
  R2Rect bound = R2Rect::FromPointPair(a, b);
  if (!rect.Intersects(bound)) return false;

  // Otherwise AB intersects "rect" if and only if all four vertices of "rect"
  // do not lie on the same side of the extended line AB.  We test this by
  // finding the two vertices of "rect" with minimum and maximum projections
  // onto the normal of AB, and computing their dot products with the edge
  // normal.
  R2Point n = (b - a).Ortho();
  int i = (n[0] >= 0) ? 1 : 0;
  int j = (n[1] >= 0) ? 1 : 0;
  double max = n.DotProd(rect.GetVertex(i, j) - a);
  double min = n.DotProd(rect.GetVertex(1-i, 1-j) - a);
  return (max >= 0) && (min <= 0);
}